

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_pipeline_layout
               (StateRecorder *recorder,VkPipelineLayoutCreateInfo *layout,Hash *out_hash)

{
  VkPushConstantRange *pVVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  Hash hash;
  ulong local_38;
  
  uVar3 = (ulong)layout->setLayoutCount;
  uVar5 = uVar3 ^ 0xaf63bd4c8601b7df;
  for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
    if (layout->pSetLayouts[uVar6] == (VkDescriptorSetLayout)0x0) {
      uVar5 = uVar5 * 0x100000001b3;
    }
    else {
      bVar2 = StateRecorder::get_hash_for_descriptor_set_layout
                        (recorder,layout->pSetLayouts[uVar6],&local_38);
      if (!bVar2) goto LAB_00114675;
      uVar5 = (local_38 & 0xffffffff ^ uVar5 * 0x100000001b3) * 0x100000001b3 ^ local_38 >> 0x20;
      uVar3 = (ulong)layout->setLayoutCount;
    }
  }
  uVar5 = uVar5 * 0x100000001b3 ^ (ulong)layout->pushConstantRangeCount;
  pVVar1 = layout->pPushConstantRanges;
  for (lVar4 = 0; (ulong)layout->pushConstantRangeCount * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    uVar5 = ((uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->stageFlags + lVar4)) *
             0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->size + lVar4)) * 0x100000001b3 ^
            (ulong)*(uint *)((long)&pVVar1->offset + lVar4);
  }
  *out_hash = uVar5 * 0x100000001b3 ^ (ulong)layout->flags;
LAB_00114675:
  return uVar3 <= uVar6;
}

Assistant:

bool compute_hash_pipeline_layout(const StateRecorder &recorder, const VkPipelineLayoutCreateInfo &layout, Hash *out_hash)
{
	Hasher h;

	h.u32(layout.setLayoutCount);
	for (uint32_t i = 0; i < layout.setLayoutCount; i++)
	{
		if (layout.pSetLayouts[i])
		{
			Hash hash;
			if (!recorder.get_hash_for_descriptor_set_layout(layout.pSetLayouts[i], &hash))
				return false;
			h.u64(hash);
		}
		else
			h.u32(0);
	}

	h.u32(layout.pushConstantRangeCount);
	for (uint32_t i = 0; i < layout.pushConstantRangeCount; i++)
	{
		auto &push = layout.pPushConstantRanges[i];
		h.u32(push.stageFlags);
		h.u32(push.size);
		h.u32(push.offset);
	}

	h.u32(layout.flags);

	*out_hash = h.get();
	return true;
}